

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void tile_mt_queue(AV1Decoder *pbi,int tile_cols,int tile_rows,int tile_rows_start,int tile_rows_end
                  ,int tile_cols_start,int tile_cols_end,int start_tile,int end_tile)

{
  pthread_mutex_t *ppVar1;
  TileJobsDec *pTVar2;
  long lVar3;
  long lVar4;
  int col;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  TileBufferDec *pTVar11;
  TileJobsDec *pTVar12;
  TileBufferDec *pTVar13;
  ulong uVar14;
  long lVar15;
  
  if (((pbi->tile_mt_info).alloc_tile_cols != tile_cols) ||
     ((pbi->tile_mt_info).alloc_tile_rows != tile_rows)) {
    av1_dealloc_dec_jobs(&pbi->tile_mt_info);
    (pbi->tile_mt_info).alloc_tile_rows = tile_rows;
    (pbi->tile_mt_info).alloc_tile_cols = tile_cols;
    uVar5 = tile_rows * tile_cols;
    ppVar1 = (pthread_mutex_t *)aom_malloc((long)(int)uVar5 * 0x28);
    (pbi->tile_mt_info).job_mutex = ppVar1;
    if (ppVar1 == (pthread_mutex_t *)0x0) {
      aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate tile_mt_info->job_mutex");
    }
    uVar14 = 0;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar14;
    }
    for (; uVar6 * 0x28 - uVar14 != 0; uVar14 = uVar14 + 0x28) {
      pthread_mutex_init((pthread_mutex_t *)((long)(pbi->tile_mt_info).job_mutex + uVar14),
                         (pthread_mutexattr_t *)0x0);
    }
    pTVar2 = (TileJobsDec *)aom_malloc((long)(int)uVar5 << 4);
    (pbi->tile_mt_info).job_queue = pTVar2;
    if (pTVar2 == (TileJobsDec *)0x0) {
      aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate tile_mt_info->job_queue");
    }
  }
  pTVar2 = (pbi->tile_mt_info).job_queue;
  (pbi->tile_mt_info).jobs_enqueued = 0;
  (pbi->tile_mt_info).jobs_dequeued = 0;
  lVar3 = (long)tile_cols_start;
  lVar4 = (long)tile_rows_start;
  pTVar11 = pbi->tile_buffers[lVar4] + lVar3;
  iVar10 = 0;
  pTVar12 = pTVar2;
  for (; lVar7 = lVar3, pTVar13 = pTVar11, lVar15 = lVar3 * 0x53a0, lVar4 < tile_rows_end;
      lVar4 = lVar4 + 1) {
    for (; lVar7 < tile_cols_end; lVar7 = lVar7 + 1) {
      iVar9 = (pbi->common).tiles.cols * (int)lVar4;
      iVar8 = iVar9 + (int)lVar7;
      if (iVar8 <= end_tile && start_tile <= iVar8) {
        pTVar12->tile_buffer = pTVar13;
        pTVar12->tile_data =
             (TileDataDec *)((long)(pbi->tile_data[iVar9].tctx.txb_skip_cdf + -2) + 0x3c + lVar15);
        pTVar12 = pTVar12 + 1;
        iVar10 = iVar10 + 1;
        (pbi->tile_mt_info).jobs_enqueued = iVar10;
      }
      pTVar13 = pTVar13 + 1;
      lVar15 = lVar15 + 0x53a0;
    }
    pTVar11 = pTVar11 + 0x40;
  }
  qsort(pTVar2,(long)iVar10,0x10,compare_tile_buffers);
  return;
}

Assistant:

static inline void tile_mt_queue(AV1Decoder *pbi, int tile_cols, int tile_rows,
                                 int tile_rows_start, int tile_rows_end,
                                 int tile_cols_start, int tile_cols_end,
                                 int start_tile, int end_tile) {
  AV1_COMMON *const cm = &pbi->common;
  if (pbi->tile_mt_info.alloc_tile_cols != tile_cols ||
      pbi->tile_mt_info.alloc_tile_rows != tile_rows) {
    av1_dealloc_dec_jobs(&pbi->tile_mt_info);
    alloc_dec_jobs(&pbi->tile_mt_info, cm, tile_rows, tile_cols);
  }
  enqueue_tile_jobs(pbi, cm, tile_rows_start, tile_rows_end, tile_cols_start,
                    tile_cols_end, start_tile, end_tile);
  qsort(pbi->tile_mt_info.job_queue, pbi->tile_mt_info.jobs_enqueued,
        sizeof(pbi->tile_mt_info.job_queue[0]), compare_tile_buffers);
}